

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Bac_ManWriteVerilogNtk(Bac_Ntk_t *p,int fUseAssign)

{
  char cVar1;
  byte bVar2;
  Vec_Str_t *pVVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  int i_2;
  long lVar16;
  int i;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long local_48;
  
  if ((p->vFanin).nSize != (p->vType).nSize) {
    __assert_fail("Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x24b,"void Bac_ManWriteVerilogNtk(Bac_Ntk_t *, int)");
  }
  pVVar3 = p->pDesign->vOut;
  lVar17 = 0;
  do {
    cVar1 = "module "[lVar17];
    uVar6 = pVVar3->nCap;
    if (pVVar3->nSize == uVar6) {
      if ((int)uVar6 < 0x10) {
        if (pVVar3->pArray == (char *)0x0) {
          pcVar11 = (char *)malloc(0x10);
        }
        else {
          pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
        }
        sVar13 = 0x10;
      }
      else {
        sVar13 = (ulong)uVar6 * 2;
        if ((int)sVar13 <= (int)uVar6) goto LAB_003a1353;
        if (pVVar3->pArray == (char *)0x0) {
          pcVar11 = (char *)malloc(sVar13);
        }
        else {
          pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
        }
      }
      pVVar3->pArray = pcVar11;
      pVVar3->nCap = (int)sVar13;
    }
LAB_003a1353:
    iVar9 = pVVar3->nSize;
    pVVar3->nSize = iVar9 + 1;
    pVVar3->pArray[iVar9] = cVar1;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 7);
  pcVar11 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  sVar13 = strlen(pcVar11);
  if (0 < (int)(uint)sVar13) {
    uVar18 = 0;
    do {
      cVar1 = pcVar11[uVar18];
      uVar6 = pVVar3->nCap;
      if (pVVar3->nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pVVar3->pArray == (char *)0x0) {
            pcVar12 = (char *)malloc(0x10);
          }
          else {
            pcVar12 = (char *)realloc(pVVar3->pArray,0x10);
          }
          sVar14 = 0x10;
        }
        else {
          sVar14 = (ulong)uVar6 * 2;
          if ((int)sVar14 <= (int)uVar6) goto LAB_003a1407;
          if (pVVar3->pArray == (char *)0x0) {
            pcVar12 = (char *)malloc(sVar14);
          }
          else {
            pcVar12 = (char *)realloc(pVVar3->pArray,sVar14);
          }
        }
        pVVar3->pArray = pcVar12;
        pVVar3->nCap = (int)sVar14;
      }
LAB_003a1407:
      iVar9 = pVVar3->nSize;
      pVVar3->nSize = iVar9 + 1;
      pVVar3->pArray[iVar9] = cVar1;
      uVar18 = uVar18 + 1;
    } while (((uint)sVar13 & 0x7fffffff) != uVar18);
  }
  lVar17 = 0;
  do {
    cVar1 = "module %s (\n    "[lVar17 + 9];
    uVar6 = pVVar3->nCap;
    if (pVVar3->nSize == uVar6) {
      if ((int)uVar6 < 0x10) {
        if (pVVar3->pArray == (char *)0x0) {
          pcVar11 = (char *)malloc(0x10);
        }
        else {
          pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
        }
        sVar13 = 0x10;
      }
      else {
        sVar13 = (ulong)uVar6 * 2;
        if ((int)sVar13 <= (int)uVar6) goto LAB_003a148f;
        if (pVVar3->pArray == (char *)0x0) {
          pcVar11 = (char *)malloc(sVar13);
        }
        else {
          pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
        }
      }
      pVVar3->pArray = pcVar11;
      pVVar3->nCap = (int)sVar13;
    }
LAB_003a148f:
    iVar9 = pVVar3->nSize;
    pVVar3->nSize = iVar9 + 1;
    pVVar3->pArray[iVar9] = cVar1;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 7);
  if (2 < (p->vInfo).nSize) {
    iVar9 = pVVar3->nSize;
    lVar17 = 0;
    do {
      uVar6 = (p->vInfo).pArray[lVar17];
      if ((int)uVar6 < 0) goto LAB_003a219e;
      if ((uVar6 & 3) != 0) {
        if (lVar17 != 0) {
          lVar16 = 0;
          do {
            cVar1 = "    \"%s\", "[lVar16 + 8];
            uVar10 = pVVar3->nCap;
            if (pVVar3->nSize == uVar10) {
              if ((int)uVar10 < 0x10) {
                if (pVVar3->pArray == (char *)0x0) {
                  pcVar11 = (char *)malloc(0x10);
                }
                else {
                  pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
                }
                sVar13 = 0x10;
              }
              else {
                sVar13 = (ulong)uVar10 * 2;
                if ((int)sVar13 <= (int)uVar10) goto LAB_003a1563;
                if (pVVar3->pArray == (char *)0x0) {
                  pcVar11 = (char *)malloc(sVar13);
                }
                else {
                  pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
                }
              }
              pVVar3->pArray = pcVar11;
              pVVar3->nCap = (int)sVar13;
            }
LAB_003a1563:
            iVar7 = pVVar3->nSize;
            pVVar3->nSize = iVar7 + 1;
            pVVar3->pArray[iVar7] = cVar1;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 2);
        }
        iVar7 = pVVar3->nSize;
        if (iVar9 + 0x46 < iVar7) {
          lVar16 = 0;
          do {
            cVar1 = "module %s (\n    "[lVar16 + 0xb];
            uVar10 = pVVar3->nCap;
            if (pVVar3->nSize == uVar10) {
              if ((int)uVar10 < 0x10) {
                if (pVVar3->pArray == (char *)0x0) {
                  pcVar11 = (char *)malloc(0x10);
                }
                else {
                  pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
                }
                sVar13 = 0x10;
              }
              else {
                sVar13 = (ulong)uVar10 * 2;
                if ((int)sVar13 <= (int)uVar10) goto LAB_003a1601;
                if (pVVar3->pArray == (char *)0x0) {
                  pcVar11 = (char *)malloc(sVar13);
                }
                else {
                  pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
                }
              }
              pVVar3->pArray = pcVar11;
              pVVar3->nCap = (int)sVar13;
            }
LAB_003a1601:
            iVar9 = pVVar3->nSize;
            pVVar3->nSize = iVar9 + 1;
            pVVar3->pArray[iVar9] = cVar1;
            lVar16 = lVar16 + 1;
            iVar9 = iVar7;
          } while (lVar16 != 5);
        }
        Bac_ManWriteVar(p,uVar6 >> 2);
      }
      iVar7 = (int)lVar17;
      lVar17 = lVar17 + 3;
    } while (iVar7 + 5 < (p->vInfo).nSize);
  }
  lVar17 = 0;
  do {
    cVar1 = "\n  );\n"[lVar17];
    uVar6 = pVVar3->nCap;
    if (pVVar3->nSize == uVar6) {
      if ((int)uVar6 < 0x10) {
        if (pVVar3->pArray == (char *)0x0) {
          pcVar11 = (char *)malloc(0x10);
        }
        else {
          pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
        }
        sVar13 = 0x10;
      }
      else {
        sVar13 = (ulong)uVar6 * 2;
        if ((int)sVar13 <= (int)uVar6) goto LAB_003a16bb;
        if (pVVar3->pArray == (char *)0x0) {
          pcVar11 = (char *)malloc(sVar13);
        }
        else {
          pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
        }
      }
      pVVar3->pArray = pcVar11;
      pVVar3->nCap = (int)sVar13;
    }
LAB_003a16bb:
    iVar9 = pVVar3->nSize;
    pVVar3->nSize = iVar9 + 1;
    pVVar3->pArray[iVar9] = cVar1;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 6);
  if (2 < (p->vInfo).nSize) {
    lVar17 = 0;
    do {
      piVar4 = (p->vInfo).pArray;
      uVar6 = piVar4[lVar17];
      if ((int)uVar6 < 0) {
LAB_003a219e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x13e,"int Abc_Lit2Att2(int)");
      }
      if ((uVar6 & 3) != 0) {
        iVar9 = piVar4[lVar17 + 1];
        iVar7 = piVar4[lVar17 + 2];
        lVar16 = 0;
        do {
          cVar1 = "\nmodule %s (\n  "[lVar16 + 0xd];
          uVar10 = pVVar3->nCap;
          if (pVVar3->nSize == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (pVVar3->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(0x10);
              }
              else {
                pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
              }
              sVar13 = 0x10;
            }
            else {
              sVar13 = (ulong)uVar10 * 2;
              if ((int)sVar13 <= (int)uVar10) goto LAB_003a1792;
              if (pVVar3->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(sVar13);
              }
              else {
                pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
              }
            }
            pVVar3->pArray = pcVar11;
            pVVar3->nCap = (int)sVar13;
          }
LAB_003a1792:
          iVar8 = pVVar3->nSize;
          pVVar3->nSize = iVar8 + 1;
          pVVar3->pArray[iVar8] = cVar1;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 2);
        pcVar11 = *(char **)(&DAT_00b7cfe0 + ((ulong)uVar6 & 3) * 8);
        sVar13 = strlen(pcVar11);
        if (0 < (int)(uint)sVar13) {
          uVar18 = 0;
          do {
            cVar1 = pcVar11[uVar18];
            uVar10 = pVVar3->nCap;
            if (pVVar3->nSize == uVar10) {
              if ((int)uVar10 < 0x10) {
                if (pVVar3->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar3->pArray,0x10);
                }
                sVar14 = 0x10;
              }
              else {
                sVar14 = (ulong)uVar10 * 2;
                if ((int)sVar14 <= (int)uVar10) goto LAB_003a1840;
                if (pVVar3->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar14);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar3->pArray,sVar14);
                }
              }
              pVVar3->pArray = pcVar12;
              pVVar3->nCap = (int)sVar14;
            }
LAB_003a1840:
            iVar8 = pVVar3->nSize;
            pVVar3->nSize = iVar8 + 1;
            pVVar3->pArray[iVar8] = cVar1;
            uVar18 = uVar18 + 1;
          } while (((uint)sVar13 & 0x7fffffff) != uVar18);
        }
        if (-1 < iVar9) {
          Bac_ManWriteRange(p,iVar9,iVar7);
        }
        Bac_ManWriteVar(p,uVar6 >> 2);
        lVar16 = 0;
        do {
          cVar1 = " .%s(%s) ) ;\n"[lVar16 + 0xb];
          uVar6 = pVVar3->nCap;
          if (pVVar3->nSize == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (pVVar3->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(0x10);
              }
              else {
                pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
              }
              sVar13 = 0x10;
            }
            else {
              sVar13 = (ulong)uVar6 * 2;
              if ((int)sVar13 <= (int)uVar6) goto LAB_003a18f6;
              if (pVVar3->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(sVar13);
              }
              else {
                pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
              }
            }
            pVVar3->pArray = pcVar11;
            pVVar3->nCap = (int)sVar13;
          }
LAB_003a18f6:
          iVar9 = pVVar3->nSize;
          pVVar3->nSize = iVar9 + 1;
          pVVar3->pArray[iVar9] = cVar1;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 2);
      }
      iVar9 = (int)lVar17;
      lVar17 = lVar17 + 3;
    } while (iVar9 + 5 < (p->vInfo).nSize);
  }
  uVar6 = pVVar3->nCap;
  if (pVVar3->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pVVar3->pArray == (char *)0x0) {
        pcVar11 = (char *)malloc(0x10);
      }
      else {
        pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
      }
      sVar13 = 0x10;
    }
    else {
      sVar13 = (ulong)uVar6 * 2;
      if ((int)sVar13 <= (int)uVar6) goto LAB_003a198b;
      if (pVVar3->pArray == (char *)0x0) {
        pcVar11 = (char *)malloc(sVar13);
      }
      else {
        pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
      }
    }
    pVVar3->pArray = pcVar11;
    pVVar3->nCap = (int)sVar13;
  }
LAB_003a198b:
  iVar9 = pVVar3->nSize;
  pVVar3->nSize = iVar9 + 1;
  pVVar3->pArray[iVar9] = '\n';
  if (0 < (p->vType).nSize) {
    local_48 = 1;
    lVar17 = 0;
    do {
      bVar2 = (p->vType).pArray[lVar17];
      if ((((byte)(bVar2 - 0x14) < 0xf8) && ((bVar2 >> 1) - 5 < 0x44)) &&
         (lVar16 = local_48, lVar19 = lVar17, lVar17 + 1 < (long)(p->vType).nSize)) {
        do {
          lVar15 = lVar16;
          if (((p->vType).pArray[lVar15] & 0xfeU) != 8) break;
          iVar9 = (int)lVar15;
          uVar6 = Bac_ObjName(p,iVar9);
          if (uVar6 == 0) goto LAB_003a21bd;
          if ((int)uVar6 < 0) goto LAB_003a219e;
          if ((uVar6 & 3) == 1) {
LAB_003a1a6b:
            lVar16 = 0;
            do {
              cVar1 = ";\n  wire "[lVar16 + 2];
              uVar6 = pVVar3->nCap;
              if (pVVar3->nSize == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (pVVar3->pArray == (char *)0x0) {
                    pcVar11 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
                  }
                  sVar13 = 0x10;
                }
                else {
                  sVar13 = (ulong)uVar6 * 2;
                  if ((int)sVar13 <= (int)uVar6) goto LAB_003a1acb;
                  if (pVVar3->pArray == (char *)0x0) {
                    pcVar11 = (char *)malloc(sVar13);
                  }
                  else {
                    pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
                  }
                }
                pVVar3->pArray = pcVar11;
                pVVar3->nCap = (int)sVar13;
              }
LAB_003a1acb:
              iVar7 = pVVar3->nSize;
              pVVar3->nSize = iVar7 + 1;
              pVVar3->pArray[iVar7] = cVar1;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 7);
            iVar7 = Bac_ManFindRealIndex(p,iVar9);
            iVar8 = Bac_ObjGetRange(p,iVar9);
            iVar8 = Bac_ManFindRealIndex(p,(int)lVar19 + iVar8);
            Bac_ManWriteRange(p,iVar7,iVar8);
            iVar9 = Bac_ManFindRealNameId(p,iVar9);
            Bac_ManWriteVar(p,iVar9);
            lVar16 = 0;
            do {
              cVar1 = " .%s(%s) ) ;\n"[lVar16 + 0xb];
              uVar6 = pVVar3->nCap;
              if (pVVar3->nSize == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (pVVar3->pArray == (char *)0x0) {
                    pcVar11 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
                  }
                  sVar13 = 0x10;
                }
                else {
                  sVar13 = (ulong)uVar6 * 2;
                  if ((int)sVar13 <= (int)uVar6) goto LAB_003a1b9f;
                  if (pVVar3->pArray == (char *)0x0) {
                    pcVar11 = (char *)malloc(sVar13);
                  }
                  else {
                    pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
                  }
                }
                pVVar3->pArray = pcVar11;
                pVVar3->nCap = (int)sVar13;
              }
LAB_003a1b9f:
              iVar9 = pVVar3->nSize;
              pVVar3->nSize = iVar9 + 1;
              pVVar3->pArray[iVar9] = cVar1;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 2);
          }
          else {
            uVar6 = Bac_ObjName(p,iVar9);
            if (uVar6 == 0) goto LAB_003a21bd;
            if ((int)uVar6 < 0) goto LAB_003a219e;
            if ((uVar6 & 3) == 2) goto LAB_003a1a6b;
          }
          lVar16 = lVar15 + 1;
          lVar19 = lVar15;
        } while ((int)(lVar15 + 1) < (p->vType).nSize);
      }
      lVar17 = lVar17 + 1;
      local_48 = local_48 + 1;
    } while (lVar17 < (p->vType).nSize);
  }
  if (0 < (p->vType).nSize) {
    bVar5 = false;
    uVar6 = 0;
    do {
      if ((int)uVar6 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar18 = (ulong)uVar6;
      bVar2 = (p->vType).pArray[uVar18];
      if (((byte)(bVar2 - 0x14) < 0xf8) && ((bVar2 >> 1) - 5 < 0x44)) {
        do {
          uVar18 = uVar18 + 1;
          if (((p->vType).nSize <= (int)uVar18) || (((p->vType).pArray[uVar18] & 0xfeU) != 8))
          goto LAB_003a1c7d;
          uVar10 = Bac_ObjName(p,(int)uVar18);
          if (uVar10 == 0) goto LAB_003a21bd;
          if ((int)uVar10 < 0) goto LAB_003a219e;
        } while ((uVar10 & 3) != 0);
        uVar6 = (p->vType).nSize;
        bVar5 = true;
      }
LAB_003a1c7d:
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < (p->vType).nSize);
    if (bVar5) {
      lVar17 = 0;
      do {
        cVar1 = ";\n  wire "[lVar17 + 1];
        uVar6 = pVVar3->nCap;
        if (pVVar3->nSize == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (pVVar3->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
            }
            sVar13 = 0x10;
          }
          else {
            sVar13 = (ulong)uVar6 * 2;
            if ((int)sVar13 <= (int)uVar6) goto LAB_003a1cf2;
            if (pVVar3->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(sVar13);
            }
            else {
              pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
            }
          }
          pVVar3->pArray = pcVar11;
          pVVar3->nCap = (int)sVar13;
        }
LAB_003a1cf2:
        iVar9 = pVVar3->nSize;
        pVVar3->nSize = iVar9 + 1;
        pVVar3->pArray[iVar9] = cVar1;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 8);
      if (0 < (p->vType).nSize) {
        iVar9 = 7;
        local_48 = 1;
        lVar17 = 0;
        do {
          bVar2 = (p->vType).pArray[lVar17];
          if ((((byte)(bVar2 - 0x14) < 0xf8) && ((bVar2 >> 1) - 5 < 0x44)) &&
             (lVar16 = local_48, lVar17 + 1 < (long)(p->vType).nSize)) {
            do {
              if (((p->vType).pArray[lVar16] & 0xfeU) != 8) break;
              iVar7 = (int)lVar16;
              uVar6 = Bac_ObjName(p,iVar7);
              if (uVar6 == 0) {
LAB_003a21bd:
                __assert_fail("n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                              ,0x107,"Bac_NameType_t Bac_NameType(int)");
              }
              if ((int)uVar6 < 0) goto LAB_003a219e;
              if ((uVar6 & 3) == 0) {
                if (0x48 < iVar9) {
                  lVar19 = 0;
                  do {
                    cVar1 = ";\n  wire "[lVar19];
                    uVar6 = pVVar3->nCap;
                    if (pVVar3->nSize == uVar6) {
                      if ((int)uVar6 < 0x10) {
                        if (pVVar3->pArray == (char *)0x0) {
                          pcVar11 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
                        }
                        sVar13 = 0x10;
                      }
                      else {
                        sVar13 = (ulong)uVar6 * 2;
                        if ((int)sVar13 <= (int)uVar6) goto LAB_003a1e29;
                        if (pVVar3->pArray == (char *)0x0) {
                          pcVar11 = (char *)malloc(sVar13);
                        }
                        else {
                          pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
                        }
                      }
                      pVVar3->pArray = pcVar11;
                      pVVar3->nCap = (int)sVar13;
                    }
LAB_003a1e29:
                    iVar9 = pVVar3->nSize;
                    pVVar3->nSize = iVar9 + 1;
                    pVVar3->pArray[iVar9] = cVar1;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 9);
                  iVar9 = 7;
                }
                if (7 < iVar9) {
                  lVar19 = 0;
                  do {
                    cVar1 = "    \"%s\", "[lVar19 + 8];
                    uVar6 = pVVar3->nCap;
                    if (pVVar3->nSize == uVar6) {
                      if ((int)uVar6 < 0x10) {
                        if (pVVar3->pArray == (char *)0x0) {
                          pcVar11 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
                        }
                        sVar13 = 0x10;
                      }
                      else {
                        sVar13 = (ulong)uVar6 * 2;
                        if ((int)sVar13 <= (int)uVar6) goto LAB_003a1ebd;
                        if (pVVar3->pArray == (char *)0x0) {
                          pcVar11 = (char *)malloc(sVar13);
                        }
                        else {
                          pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
                        }
                      }
                      pVVar3->pArray = pcVar11;
                      pVVar3->nCap = (int)sVar13;
                    }
LAB_003a1ebd:
                    iVar8 = pVVar3->nSize;
                    pVVar3->nSize = iVar8 + 1;
                    pVVar3->pArray[iVar8] = cVar1;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 2);
                }
                pcVar11 = Bac_ObjNameStr(p,iVar7);
                sVar13 = strlen(pcVar11);
                if (0 < (int)(uint)sVar13) {
                  uVar18 = 0;
                  do {
                    cVar1 = pcVar11[uVar18];
                    uVar6 = pVVar3->nCap;
                    if (pVVar3->nSize == uVar6) {
                      if ((int)uVar6 < 0x10) {
                        if (pVVar3->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar3->pArray,0x10);
                        }
                        sVar14 = 0x10;
                      }
                      else {
                        sVar14 = (ulong)uVar6 * 2;
                        if ((int)sVar14 <= (int)uVar6) goto LAB_003a1f6c;
                        if (pVVar3->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(sVar14);
                        }
                        else {
                          pcVar12 = (char *)realloc(pVVar3->pArray,sVar14);
                        }
                      }
                      pVVar3->pArray = pcVar12;
                      pVVar3->nCap = (int)sVar14;
                    }
LAB_003a1f6c:
                    iVar8 = pVVar3->nSize;
                    pVVar3->nSize = iVar8 + 1;
                    pVVar3->pArray[iVar8] = cVar1;
                    uVar18 = uVar18 + 1;
                  } while (((uint)sVar13 & 0x7fffffff) != uVar18);
                }
                pcVar11 = Bac_ObjNameStr(p,iVar7);
                sVar13 = strlen(pcVar11);
                iVar9 = iVar9 + (int)sVar13;
              }
              lVar16 = lVar16 + 1;
            } while ((int)lVar16 < (p->vType).nSize);
          }
          lVar17 = lVar17 + 1;
          local_48 = local_48 + 1;
        } while (lVar17 < (p->vType).nSize);
      }
      lVar17 = 0;
      do {
        cVar1 = " .%s(%s) ) ;\n"[lVar17 + 0xb];
        uVar6 = pVVar3->nCap;
        if (pVVar3->nSize == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (pVVar3->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
            }
            sVar13 = 0x10;
          }
          else {
            sVar13 = (ulong)uVar6 * 2;
            if ((int)sVar13 <= (int)uVar6) goto LAB_003a204a;
            if (pVVar3->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(sVar13);
            }
            else {
              pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
            }
          }
          pVVar3->pArray = pcVar11;
          pVVar3->nCap = (int)sVar13;
        }
LAB_003a204a:
        iVar9 = pVVar3->nSize;
        pVVar3->nSize = iVar9 + 1;
        pVVar3->pArray[iVar9] = cVar1;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 2);
    }
  }
  uVar6 = pVVar3->nCap;
  if (pVVar3->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pVVar3->pArray == (char *)0x0) {
        pcVar11 = (char *)malloc(0x10);
      }
      else {
        pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
      }
      sVar13 = 0x10;
    }
    else {
      sVar13 = (ulong)uVar6 * 2;
      if ((int)sVar13 <= (int)uVar6) goto LAB_003a20ce;
      if (pVVar3->pArray == (char *)0x0) {
        pcVar11 = (char *)malloc(sVar13);
      }
      else {
        pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
      }
    }
    pVVar3->pArray = pcVar11;
    pVVar3->nCap = (int)sVar13;
  }
LAB_003a20ce:
  iVar9 = pVVar3->nSize;
  pVVar3->nSize = iVar9 + 1;
  pVVar3->pArray[iVar9] = '\n';
  Bac_ManWriteVerilogBoxes(p,fUseAssign);
  lVar17 = 0;
  do {
    cVar1 = "\nendmodule\n\n"[lVar17 + 1];
    uVar6 = pVVar3->nCap;
    if (pVVar3->nSize == uVar6) {
      if ((int)uVar6 < 0x10) {
        if (pVVar3->pArray == (char *)0x0) {
          pcVar11 = (char *)malloc(0x10);
        }
        else {
          pcVar11 = (char *)realloc(pVVar3->pArray,0x10);
        }
        sVar13 = 0x10;
      }
      else {
        sVar13 = (ulong)uVar6 * 2;
        if ((int)sVar13 <= (int)uVar6) goto LAB_003a214e;
        if (pVVar3->pArray == (char *)0x0) {
          pcVar11 = (char *)malloc(sVar13);
        }
        else {
          pcVar11 = (char *)realloc(pVVar3->pArray,sVar13);
        }
      }
      pVVar3->pArray = pcVar11;
      pVVar3->nCap = (int)sVar13;
    }
LAB_003a214e:
    iVar9 = pVVar3->nSize;
    pVVar3->nSize = iVar9 + 1;
    pVVar3->pArray[iVar9] = cVar1;
    lVar17 = lVar17 + 1;
    if (lVar17 == 0xb) {
      return;
    }
  } while( true );
}

Assistant:

void Bac_ManWriteVerilogNtk( Bac_Ntk_t * p, int fUseAssign )
{
    char * pKeyword[4] = { "wire ", "input ", "output ", "inout " };
    Vec_Str_t * vStr = p->pDesign->vOut;
    int k, iObj, iTerm, Value, Beg, End, Length, fHaveWires, StartPos;
//    assert( Bac_NtkInfoNum(p) );
    assert( Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p) );
//    Bac_NtkPrint( p );
    // write header
    Vec_StrPrintStr( vStr, "module " );
    Vec_StrPrintStr( vStr, Bac_NtkName(p) );
    Vec_StrPrintStr( vStr, " (\n    " );
    StartPos = Vec_StrSize(vStr);
    Vec_IntForEachEntryTriple( &p->vInfo, Value, Beg, End, k )
    if ( Abc_Lit2Att2(Value) != 0 )
    {
        Vec_StrPrintStr( vStr, k ? ", " : "" );
        if ( Vec_StrSize(vStr) > StartPos + 70 )
        {
            StartPos = Vec_StrSize(vStr);
            Vec_StrPrintStr( vStr, "\n    " );
        }
        Bac_ManWriteVar( p, Abc_Lit2Var2(Value) );
    }
    Vec_StrPrintStr( vStr, "\n  );\n" );
    // write inputs/outputs
    Vec_IntForEachEntryTriple( &p->vInfo, Value, Beg, End, k )
    if ( Abc_Lit2Att2(Value) != 0 )
    {
        Vec_StrPrintStr( vStr, "  " );
        Vec_StrPrintStr( vStr, pKeyword[Abc_Lit2Att2(Value)] );
        if ( Beg >= 0 )
            Bac_ManWriteRange( p, Beg, End );
        Bac_ManWriteVar( p, Abc_Lit2Var2(Value) );
        Vec_StrPrintStr( vStr, ";\n" );
    }
    Vec_StrPrintStr( vStr, "\n" );
    // write word-level wires
    Bac_NtkForEachBox( p, iObj )
    if ( !Bac_ObjIsConst(p, iObj) )
        Bac_BoxForEachBo( p, iObj, iTerm, k )
        if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_WORD || Bac_ObjNameType(p, iTerm) == BAC_NAME_INFO )
        {
            Vec_StrPrintStr( vStr, "  wire " );
            Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, iTerm), Bac_ManFindRealIndex(p, iTerm + Bac_ObjGetRange(p, iTerm) - 1) );
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, iTerm) );
            Vec_StrPrintStr( vStr, ";\n" );
        }
    // check if there are any wires left
    fHaveWires = 0;
    Bac_NtkForEachBox( p, iObj )
    if ( !Bac_ObjIsConst(p, iObj) )
        Bac_BoxForEachBo( p, iObj, iTerm, k )
        if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_BIN )
        { fHaveWires = 1; iObj = Bac_NtkObjNum(p); break; }
    // write bit-level wires
    if ( fHaveWires )
    {
        Length = 7;
        Vec_StrPrintStr( vStr, "\n  wire " );
        Bac_NtkForEachBox( p, iObj )
        if ( !Bac_ObjIsConst(p, iObj) )
            Bac_BoxForEachBo( p, iObj, iTerm, k )
            if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_BIN )
            {
                if ( Length > 72 )
                    Vec_StrPrintStr( vStr, ";\n  wire " ), Length = 7;
                if ( Length > 7 )
                    Vec_StrPrintStr( vStr, ", " );
                Vec_StrPrintStr( vStr, Bac_ObjNameStr(p, iTerm) ); 
                Length += strlen(Bac_ObjNameStr(p, iTerm));
            }
        Vec_StrPrintStr( vStr, ";\n" );
    }
    Vec_StrPrintStr( vStr, "\n" );
    // write objects
    Bac_ManWriteVerilogBoxes( p, fUseAssign );
    Vec_StrPrintStr( vStr, "endmodule\n\n" );
}